

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrEnumerateReferenceSpaces
                   (XrSession session,uint32_t spaceCapacityInput,uint32_t *spaceCountOutput,
                   XrReferenceSpaceType *spaces)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_3c;
  LoaderInstance *pLStack_38;
  XrResult result;
  LoaderInstance *loader_instance;
  XrReferenceSpaceType *spaces_local;
  uint32_t *spaceCountOutput_local;
  XrSession pXStack_18;
  uint32_t spaceCapacityInput_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)spaces;
  spaces_local = spaceCountOutput;
  spaceCountOutput_local._4_4_ = spaceCapacityInput;
  pXStack_18 = session;
  local_3c = ActiveLoaderInstance::Get(&stack0xffffffffffffffc8,"xrEnumerateReferenceSpaces");
  if (XR_ERROR_VALIDATION_FAILURE < local_3c) {
    this = LoaderInstance::DispatchTable(pLStack_38);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_3c = (*pXVar1->EnumerateReferenceSpaces)
                         (pXStack_18,spaceCountOutput_local._4_4_,spaces_local,
                          (XrReferenceSpaceType *)loader_instance);
  }
  return local_3c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEnumerateReferenceSpaces(
    XrSession                                   session,
    uint32_t                                    spaceCapacityInput,
    uint32_t*                                   spaceCountOutput,
    XrReferenceSpaceType*                       spaces) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEnumerateReferenceSpaces");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EnumerateReferenceSpaces(session, spaceCapacityInput, spaceCountOutput, spaces);
    }
    return result;
}